

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderCheckMark(ImDrawList *draw_list,ImVec2 pos,ImU32 col,float sz)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ImDrawList *in_RDI;
  undefined1 in_ZMM0 [64];
  float in_XMM1_Da;
  float by;
  float bx;
  float third;
  float thickness;
  ImVec2 *in_stack_ffffffffffffff98;
  ImDrawList *this;
  ImDrawList *pIVar3;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  float local_30;
  float local_2c;
  float local_28;
  ImVec2 local_24;
  float local_1c;
  float local_18;
  ImDrawList *local_10;
  ImVec2 local_8;
  
  local_8 = (ImVec2)vmovlpd_avx(in_ZMM0._0_16_);
  local_18 = in_XMM1_Da;
  local_10 = in_RDI;
  local_1c = ImMax<float>(in_XMM1_Da / 5.0,1.0);
  auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)-local_1c),
                           ZEXT416((uint)local_18));
  local_18 = auVar1._0_4_;
  ImVec2::ImVec2(&local_24,local_1c * 0.25,local_1c * 0.25);
  ::operator+=(&local_8,&local_24);
  local_28 = local_18 / 3.0;
  local_2c = local_8.x + local_28;
  auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)-local_28),
                           ZEXT416((uint)(local_8.y + local_18)));
  local_30 = auVar1._0_4_;
  this = local_10;
  ImVec2::ImVec2(&local_38,local_2c - local_28,local_30 - local_28);
  ImDrawList::PathLineTo(this,in_stack_ffffffffffffff98);
  pIVar3 = local_10;
  ImVec2::ImVec2(&local_40,local_2c,local_30);
  ImDrawList::PathLineTo(this,in_stack_ffffffffffffff98);
  auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)local_28),
                           ZEXT416((uint)local_2c));
  auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)-local_28),
                           ZEXT416((uint)local_30));
  ImVec2::ImVec2(&local_48,auVar1._0_4_,auVar2._0_4_);
  ImDrawList::PathLineTo(this,in_stack_ffffffffffffff98);
  ImDrawList::PathStroke
            (local_10,(ImU32)((ulong)pIVar3 >> 0x20),SUB81((ulong)pIVar3 >> 0x18,0),
             (float)((ulong)this >> 0x20));
  return;
}

Assistant:

void ImGui::RenderCheckMark(ImDrawList* draw_list, ImVec2 pos, ImU32 col, float sz)
{
    float thickness = ImMax(sz / 5.0f, 1.0f);
    sz -= thickness * 0.5f;
    pos += ImVec2(thickness * 0.25f, thickness * 0.25f);

    float third = sz / 3.0f;
    float bx = pos.x + third;
    float by = pos.y + sz - third * 0.5f;
    draw_list->PathLineTo(ImVec2(bx - third, by - third));
    draw_list->PathLineTo(ImVec2(bx, by));
    draw_list->PathLineTo(ImVec2(bx + third * 2.0f, by - third * 2.0f));
    draw_list->PathStroke(col, false, thickness);
}